

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall xray_re::cse_alife_creature_actor::state_read(cse_alife_creature_actor *this)

{
  xr_packet *in_RSI;
  
  state_read((cse_alife_creature_actor *)&this[-1].super_cse_alife_creature_abstract.field_0xe0,
             in_RSI,0);
  return;
}

Assistant:

void cse_alife_creature_actor::state_read(xr_packet& packet, uint16_t size)
{
	if (m_version < CSE_VERSION_0x15) {
		packet.r_u8(m_s_team);
		packet.r_u8(m_s_squad);
		packet.r_u8(m_s_group);
		if (m_version > CSE_VERSION_0x12)
			packet.r_float(m_health);
		if (m_version >= CSE_VERSION_0x03)
			cse_visual::visual_read(packet, m_version);
	} else {
		cse_alife_creature_abstract::state_read(packet, size);
		cse_alife_trader_abstract::state_read(packet, size);
		if (m_version < CSE_VERSION_0x20)
			cse_visual::visual_read(packet, m_version);
	}
	if (m_version > CSE_VERSION_0x5b)
		cse_ph_skeleton::state_read(packet, size);
	if (m_version > CSE_VERSION_0x58)
		packet.r_u16(m_holder_id);
}